

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

RegOpnd * __thiscall IRBuilder::EnsureLoopBodyForInEnumeratorArrayOpnd(IRBuilder *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *dstOpnd;
  StackSym *sym;
  RegOpnd *baseOpnd;
  IndirOpnd *src1Opnd;
  Instr *instr;
  
  bVar2 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x4de,"(this->IsLoopBody())","this->IsLoopBody()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  dstOpnd = this->m_loopBodyForInEnumeratorArrayOpnd;
  if (dstOpnd == (RegOpnd *)0x0) {
    dstOpnd = IR::RegOpnd::New(TyUint64,this->m_func);
    this->m_loopBodyForInEnumeratorArrayOpnd = dstOpnd;
    sym = Func::EnsureLoopParamSym(this->m_func);
    baseOpnd = IR::RegOpnd::New(sym,TyUint64,this->m_func);
    src1Opnd = IR::IndirOpnd::New(baseOpnd,0x70,TyUint64,this->m_func,false);
    instr = IR::Instr::New(Ld_A,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    IR::Instr::InsertAfter(this->m_func->m_headInstr,instr);
  }
  return dstOpnd;
}

Assistant:

IR::RegOpnd *
IRBuilder::EnsureLoopBodyForInEnumeratorArrayOpnd()
{
    Assert(this->IsLoopBody());
    IR::RegOpnd * loopBodyForInEnumeratorArrayOpnd = this->m_loopBodyForInEnumeratorArrayOpnd;
    if (loopBodyForInEnumeratorArrayOpnd == nullptr)
    {
        loopBodyForInEnumeratorArrayOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
        this->m_loopBodyForInEnumeratorArrayOpnd = loopBodyForInEnumeratorArrayOpnd;
        StackSym *loopParamSym = m_func->EnsureLoopParamSym();
        IR::RegOpnd *loopParamOpnd = IR::RegOpnd::New(loopParamSym, TyMachPtr, m_func);

        IR::Instr * ldInstr = IR::Instr::New(Js::OpCode::Ld_A, loopBodyForInEnumeratorArrayOpnd,
            IR::IndirOpnd::New(loopParamOpnd, Js::InterpreterStackFrame::GetOffsetOfForInEnumerators(), TyMachPtr, this->m_func),
            this->m_func);
        m_func->m_headInstr->InsertAfter(ldInstr);
    }
    return loopBodyForInEnumeratorArrayOpnd;
}